

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2
          (RenderReadPixelsRenderbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  ostringstream *this_00;
  Functions *gl;
  TextureFormat log;
  glReadPixelsFunc p_Var1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined8 *puVar5;
  RGBA threshold8;
  Surface screen;
  Renderbuffer renderbuffer;
  Framebuffer framebuffer;
  Surface refSurface;
  IVec4 threshold;
  IVec4 bitDepth;
  undefined1 local_1b0 [32];
  void *local_190;
  
  gl = api->m_gl;
  tcu::getTextureFormatMantissaBitDepth((tcu *)&bitDepth,(TextureFormat *)reference);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&framebuffer,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&screen,8);
  tcu::operator-((tcu *)&renderbuffer,(Vector<int,_4> *)&screen,(Vector<int,_4> *)&bitDepth);
  tcu::operator<<((tcu *)local_1b0,(Vector<int,_4> *)&framebuffer,(Vector<int,_4> *)&renderbuffer);
  tcu::operator*((tcu *)&threshold,2,(Vector<int,_4> *)local_1b0);
  if (0xfe < threshold.m_data[0]) {
    threshold.m_data[0] = 0xff;
  }
  if (threshold.m_data[0] < 1) {
    threshold.m_data[0] = 0;
  }
  if (0xfe < threshold.m_data[1]) {
    threshold.m_data[1] = 0xff;
  }
  if (threshold.m_data[1] < 1) {
    threshold.m_data[1] = 0;
  }
  if (0xfe < threshold.m_data[2]) {
    threshold.m_data[2] = 0xff;
  }
  if (threshold.m_data[2] < 1) {
    threshold.m_data[2] = 0;
  }
  iVar3 = 0xff;
  if (threshold.m_data[3] < 0xff) {
    iVar3 = threshold.m_data[3];
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  threshold8.m_value =
       threshold.m_data[2] << 0x10 | iVar3 << 0x18 | threshold.m_data[1] << 8 | threshold.m_data[0];
  log = (TextureFormat)(api->super_CallLogWrapper).m_log;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&framebuffer,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&renderbuffer,gl);
  tcu::Surface::Surface(&screen,reference->m_width,reference->m_height);
  tcu::Surface::Surface(&refSurface,reference->m_width,reference->m_height);
  if (2 < (reference->super_TextureLevelPyramid).m_format.order - D) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Reading with ReadPixels from renderbuffer");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2ca);
    (*gl->bindRenderbuffer)(0x8d41,renderbuffer.super_ObjectWrapper.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cb);
    imageTargetRenderbuffer
              ((api->super_ImageApi).m_egl,gl,
               ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
                m_data.ptr)->m_image);
    framebufferRenderbuffer(gl,0x8ce0,renderbuffer.super_ObjectWrapper.m_object);
    (*gl->viewport)(0,0,reference->m_width,reference->m_height);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cf);
    p_Var1 = gl->readPixels;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&screen);
    (*p_Var1)(0,0,screen.m_width,screen.m_height,0x1908,0x1401,local_190);
    (*gl->bindFramebuffer)(0x8d40,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d3);
    (*gl->bindRenderbuffer)(0x8d41,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d4);
    (*gl->finish)();
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"finish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d5);
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&refSurface);
    tcu::copy((EVP_PKEY_CTX *)local_1b0,
              (EVP_PKEY_CTX *)
              (reference->super_TextureLevelPyramid).m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start);
    bVar2 = tcu::pixelThresholdCompare
                      ((TestLog *)log,"Renderbuffer read","Result from reading renderbuffer",
                       &refSurface,&screen,&threshold8,COMPARE_LOG_RESULT);
    tcu::Surface::~Surface(&refSurface);
    tcu::Surface::~Surface(&screen);
    glu::ObjectWrapper::~ObjectWrapper(&renderbuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
    return bVar2;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_01e109b8;
  __cxa_throw(puVar5,&IllegalRendererException::typeinfo,std::exception::~exception);
}

Assistant:

bool GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl				= api.m_gl;
	const tcu::IVec4		bitDepth		= tcu::getTextureFormatMantissaBitDepth(reference.getFormat());
	const tcu::IVec4		threshold		(2 * (tcu::IVec4(1) << (tcu::IVec4(8) - bitDepth)));
	const tcu::RGBA			threshold8		((deUint8)(de::clamp(threshold[0], 0, 255)), (deUint8)(de::clamp(threshold[1], 0, 255)), (deUint8)(de::clamp(threshold[2], 0, 255)), (deUint8)(de::clamp(threshold[3], 0, 255)));
	tcu::TestLog&			log				= api.getLog();
	Framebuffer				framebuffer		(gl);
	Renderbuffer			renderbuffer	(gl);
	tcu::Surface			screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface			refSurface		(reference.getWidth(), reference.getHeight());

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for depth attachments
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for stencil attachments

	log << tcu::TestLog::Message << "Reading with ReadPixels from renderbuffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	return tcu::pixelThresholdCompare(log, "Renderbuffer read", "Result from reading renderbuffer", refSurface, screen, threshold8, tcu::COMPARE_LOG_RESULT);

}